

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::declarationList(GrpParser *this)

{
  ASTFactory *this_00;
  uint uVar1;
  RefAST *child;
  RefAST declarationList_AST;
  ASTPair currentAST;
  RefCount<AST> local_68;
  RefAST *local_60;
  ASTPair local_58;
  RefAST local_40;
  RefAST local_38;
  
  local_60 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(local_60,&nullAST);
  local_68.ref = nullAST.ref;
  local_58.root.ref = (Ref *)0x0;
  local_58.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_68.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  this_00 = &(this->super_LLkParser).super_Parser.astFactory;
  while( true ) {
    uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (0x39 < uVar1) break;
    if ((0x200000000802000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if ((0x4200UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) break;
      topDecl(this);
      local_40.ref = local_60->ref;
      if (local_40.ref == (Ref *)0x0) {
        local_40.ref = (Ref *)0x0;
      }
      else {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      child = &local_40;
      ASTFactory::addASTChild(this_00,&local_58,child);
    }
    else {
      globalDecl(this);
      local_38.ref = local_60->ref;
      if (local_38.ref == (Ref *)0x0) {
        local_38.ref = (Ref *)0x0;
      }
      else {
        (local_38.ref)->count = (local_38.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_00,&local_58,&local_38);
      child = &local_38;
    }
    RefCount<AST>::~RefCount(child);
  }
  RefCount<AST>::operator=(&local_68,&local_58.root);
  RefCount<AST>::operator=(local_60,&local_68);
  RefCount<AST>::~RefCount(&local_68);
  RefCount<AST>::~RefCount(&local_58.child);
  RefCount<AST>::~RefCount(&local_58.root);
  return;
}

Assistant:

void GrpParser::declarationList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST declarationList_AST = nullAST;
	
	try {      // for error handling
		{
		do {
			switch ( LA(1)) {
			case IDENT:
			case LITERAL_glyph:
			case LITERAL_position:
			{
				globalDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_environment:
			case LITERAL_table:
			{
				topDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop4;
			}
			}
		} while (true);
		_loop4:;
		}
		declarationList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_0);
	}
	returnAST = declarationList_AST;
}